

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.h
# Opt level: O2

cmCommand * __thiscall cmSetPropertyCommand::Clone(cmSetPropertyCommand *this)

{
  cmSetPropertyCommand *this_00;
  
  this_00 = (cmSetPropertyCommand *)operator_new(0xa8);
  cmSetPropertyCommand(this_00);
  return &this_00->super_cmCommand;
}

Assistant:

cmCommand* Clone() override { return new cmSetPropertyCommand; }